

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys.c
# Opt level: O0

REF_STATUS ref_phys_flip_twod_yz(REF_NODE ref_node,REF_INT ldim,REF_DBL *field)

{
  REF_DBL RVar1;
  int local_34;
  REF_INT nequ;
  REF_DBL temp;
  REF_INT node;
  REF_DBL *field_local;
  REF_INT ldim_local;
  REF_NODE ref_node_local;
  
  local_34 = 0;
  if ((5 < ldim) && (ldim % 5 == 0)) {
    local_34 = 5;
  }
  if ((6 < ldim) && (ldim % 6 == 0)) {
    local_34 = 6;
  }
  for (temp._4_4_ = 0; temp._4_4_ < ref_node->max; temp._4_4_ = temp._4_4_ + 1) {
    if (((-1 < temp._4_4_) && (temp._4_4_ < ref_node->max)) && (-1 < ref_node->global[temp._4_4_]))
    {
      if (4 < ldim) {
        RVar1 = field[ldim * temp._4_4_ + 2];
        field[ldim * temp._4_4_ + 2] = field[ldim * temp._4_4_ + 3];
        field[ldim * temp._4_4_ + 3] = RVar1;
      }
      if (local_34 != 0) {
        RVar1 = field[local_34 + 2 + ldim * temp._4_4_];
        field[local_34 + 2 + ldim * temp._4_4_] = field[local_34 + 3 + ldim * temp._4_4_];
        field[local_34 + 3 + ldim * temp._4_4_] = RVar1;
      }
    }
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_phys_flip_twod_yz(REF_NODE ref_node, REF_INT ldim,
                                         REF_DBL *field) {
  REF_INT node;
  REF_DBL temp;
  REF_INT nequ;

  nequ = 0;
  if (ldim > 5 && 0 == ldim % 5) nequ = 5;
  if (ldim > 6 && 0 == ldim % 6) nequ = 6;

  each_ref_node_valid_node(ref_node, node) {
    if (ldim >= 5) {
      temp = field[2 + ldim * node];
      field[2 + ldim * node] = field[3 + ldim * node];
      field[3 + ldim * node] = temp;
    }
    if (nequ > 0) {
      temp = field[nequ + 2 + ldim * node];
      field[nequ + 2 + ldim * node] = field[nequ + 3 + ldim * node];
      field[nequ + 3 + ldim * node] = temp;
    }
  }

  return REF_SUCCESS;
}